

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O1

_Bool target_set_interactive(wchar_t mode,wchar_t x,wchar_t y)

{
  uint32_t *puVar1;
  short sVar2;
  short sVar3;
  wchar_t wVar4;
  object *poVar5;
  chunk_conflict *pcVar6;
  ulong uVar7;
  byte bVar8;
  _Bool _Var9;
  _Bool _Var10;
  char cVar11;
  ushort uVar12;
  int iVar13;
  wchar_t wVar14;
  loc lVar15;
  monster *pmVar16;
  object *poVar17;
  loc grid2;
  monster *cmd;
  loc_conflict lVar18;
  wchar_t wVar19;
  code *pred;
  long lVar20;
  ulong uVar21;
  int iVar22;
  int *a;
  player *ppVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  wchar_t *c;
  bool bVar27;
  ui_event e;
  ui_event e_00;
  ui_event e_01;
  ui_event e_02;
  ui_event e_03;
  ui_event e_04;
  ui_event e_05;
  ui_event e_06;
  ui_event e_07;
  ui_event e_08;
  ui_event e_09;
  ui_event e_10;
  ui_event e_11;
  ui_event e_12;
  ui_event e_13;
  ui_event e_14;
  ui_event e_15;
  ui_event e_16;
  ui_event e_17;
  ui_event e_18;
  ui_event e_19;
  ui_event e_20;
  ui_event e_21;
  ui_event e_22;
  keypress ch;
  keypress ch_00;
  _Bool show_interesting;
  wchar_t local_908;
  wchar_t local_904;
  wchar_t local_900;
  wchar_t target_index;
  ulong local_8f8;
  _Bool local_8ea;
  byte local_8e9;
  point_set *targets;
  undefined4 local_8dc;
  ulong local_8d8;
  uint local_8cc;
  ulong local_8c8;
  wchar_t local_8bc;
  object *local_8b8;
  int *local_8b0;
  wchar_t *local_8a8;
  uint local_89c;
  uint local_898;
  wchar_t local_894;
  loc new_grid;
  ui_event local_860 [2];
  wchar_t hgt;
  wchar_t wid;
  loc path_g [256];
  
  show_interesting = true;
  local_900 = mode;
  bVar8 = cmd_lookup_key(CMD_IGNORE,(uint)(player->opts).opt[1]);
  local_8a8 = (wchar_t *)mem_zalloc((ulong)z_info->max_range << 2);
  local_8b0 = (int *)mem_zalloc((ulong)z_info->max_range << 2);
  pcVar6 = cave;
  if (y != L'\xffffffff' && x != L'\xffffffff') {
    local_908 = y;
    lVar15 = (loc)loc(x,y);
    _Var9 = square_in_bounds_fully(pcVar6,lVar15);
    if (_Var9) {
      show_interesting = false;
      goto LAB_002084e4;
    }
  }
  x = (player->grid).x;
  local_908 = (player->grid).y;
LAB_002084e4:
  local_89c = (uint)bVar8;
  target_set_monster((monster *)0x0);
  disallow_animations();
  Term_get_size(&wid,&hgt);
  local_8bc = hgt + L'\xffffffff';
  prt("Press \'?\' for help.",local_8bc,L'\0');
  targets = target_get_monsters(local_900,(monster_predicate)0x0,true);
  target_index = L'\0';
  uVar26 = 0;
  local_8d8 = 0;
  do {
    if (show_interesting == true) {
      iVar13 = point_set_size((point_set_conflict *)targets);
      local_8dc = CONCAT31((int3)((uint)iVar13 >> 8),iVar13 != 0);
    }
    else {
      local_8dc = 0;
    }
    local_8ea = (_Bool)((byte)local_8dc ^ 1);
    local_8f8 = uVar26;
    if (local_8ea == false) {
      x = targets->pts[target_index].x;
      local_908 = targets->pts[target_index].y;
      adjust_panel_help(local_908,x,(_Bool)((byte)local_8d8 & 1),player,local_900,(point_set **)0x0,
                        (_Bool *)0x0,(int *)0x0);
    }
    wVar14 = local_908;
    pcVar6 = cave;
    local_904 = x;
    if ((local_8d8 & 1) != 0) {
      lVar15 = (loc)loc(x,local_908);
      pmVar16 = square_monster(pcVar6,lVar15);
      _Var9 = target_able(pmVar16);
      pcVar6 = cave;
      if ((local_900 & 1U) == 0) {
        lVar15 = (loc)loc(x,wVar14);
        poVar17 = square_object(pcVar6,lVar15);
        while ((bVar27 = poVar17 != (object *)0x0, bVar27 &&
               (_Var10 = is_unknown(cave->objects[poVar17->oidx]), _Var10))) {
          poVar17 = poVar17->next;
        }
      }
      else {
        bVar27 = false;
      }
      target_display_help(_Var9,bVar27,local_8ea);
    }
    pcVar6 = cave;
    uVar12 = z_info->max_range;
    lVar15 = (loc)loc((player->grid).x,(player->grid).y);
    grid2 = (loc)loc(local_904,local_908);
    wVar14 = project_path((chunk *)pcVar6,path_g,(uint)uVar12,lVar15,grid2,L'င');
    uVar26 = 0;
    local_894 = wVar14;
    if ((local_900 & 1U) != 0) {
      if ((wVar14 & 0xffffU) != 0) {
        local_898 = wVar14 & 0xffffU;
        local_8e9 = panel_contains((player->grid).y,(player->grid).x);
        local_8c8 = 0;
        local_8cc = 0;
        a = local_8b0;
        c = local_8a8;
        do {
          wVar19 = path_g[local_8c8].x;
          wVar4 = path_g[local_8c8].y;
          lVar15.y = wVar4;
          lVar15.x = wVar19;
          pmVar16 = square_monster(cave,lVar15);
          local_8b8 = square_object((chunk_conflict *)player->cave,lVar15);
          _Var9 = panel_contains(wVar4,wVar19);
          bVar8 = local_8e9;
          if (_Var9) {
            move_cursor_relative(wVar4,wVar19);
            Term_what(Term->scr->cx,Term->scr->cy,a,c);
            wVar19 = L'\b';
            if ((local_8cc & 1) == 0) {
              if ((pmVar16 == (monster *)0x0) || (_Var9 = monster_is_visible(pmVar16), !_Var9)) {
                wVar19 = L'\v';
                if (local_8b8 == (object *)0x0) {
                  _Var9 = square_isknown(cave,lVar15);
                  if (_Var9) {
                    _Var9 = square_isprojectable((chunk_conflict *)player->cave,lVar15);
                    wVar19 = L'\x06';
                    if (!_Var9) goto LAB_002088e5;
                  }
                  _Var9 = square_isknown(cave,lVar15);
                  wVar19 = L'\b';
                  if (_Var9) {
                    wVar19 = L'\x01';
                  }
                  local_8cc = local_8cc & 0xff;
                  if (!_Var9) {
                    local_8cc = 1;
                  }
                }
              }
              else {
                _Var9 = monster_is_mimicking(pmVar16);
                wVar19 = L'\v';
                if (!_Var9) {
                  _Var9 = monster_is_camouflaged(pmVar16);
                  if (_Var9) {
                    if (local_8b8 == (object *)0x0) {
                      _Var9 = square_isknown(cave,lVar15);
                      if (_Var9) {
                        _Var9 = square_isprojectable((chunk_conflict *)player->cave,lVar15);
                        wVar19 = L'\x06';
                        if (!_Var9) goto LAB_002088e5;
                      }
                      wVar19 = L'\x01';
                    }
                  }
                  else {
                    wVar19 = L'\f';
                  }
                }
              }
            }
LAB_002088e5:
            Term_addch(wVar19,L'*');
            local_8e9 = 1;
            bVar8 = 0;
          }
          uVar26 = local_8c8;
          if ((bVar8 & 1) != 0) goto LAB_0020893a;
          local_8c8 = local_8c8 + 1;
          c = c + 1;
          a = a + 1;
        } while ((uint)(wVar14 & 0xffff) != local_8c8);
        uVar26 = (ulong)local_898;
      }
LAB_0020893a:
      uVar26 = CONCAT71((int7)(uVar26 >> 8),(int)uVar26 != 0);
    }
    ppVar23 = (player *)0x14;
    local_8c8 = uVar26;
    coords_desc((char *)&new_grid,L'\x14',local_908,local_904);
    _Var9 = aux_reinit((chunk *)cave,ppVar23,(target_aux_state *)&new_grid);
    if (!_Var9) {
      iVar13 = 0;
      do {
        iVar22 = iVar13 + 1;
        if (5 < iVar13) {
          iVar22 = 0;
        }
        cVar11 = (*(code *)(&PTR_aux_reinit_002867a0)[iVar22])
                           (cave,player,(target_aux_state *)&new_grid);
        iVar13 = iVar22;
      } while (cVar11 == '\0');
    }
    ch_00.mods = local_860[0].key.mods;
    ch_00._0_8_ = local_860[0].mouse;
    ch.mods = local_860[0].key.mods;
    ch._0_8_ = local_860[0].mouse;
    e_22.key.mods = local_860[0].key.mods;
    e_22.mouse = (mouseclick)local_860[0]._0_8_;
    e_21.key.mods = local_860[0].key.mods;
    e_21.mouse = (mouseclick)local_860[0]._0_8_;
    e_20.key.mods = local_860[0].key.mods;
    e_20.mouse = (mouseclick)local_860[0]._0_8_;
    e_19.key.mods = local_860[0].key.mods;
    e_19.mouse = (mouseclick)local_860[0]._0_8_;
    e_18.key.mods = local_860[0].key.mods;
    e_18.mouse = (mouseclick)local_860[0]._0_8_;
    e_17.key.mods = local_860[0].key.mods;
    e_17.mouse = (mouseclick)local_860[0]._0_8_;
    e_16.key.mods = local_860[0].key.mods;
    e_16.mouse = (mouseclick)local_860[0]._0_8_;
    e_15.key.mods = local_860[0].key.mods;
    e_15.mouse = (mouseclick)local_860[0]._0_8_;
    e_14.key.mods = local_860[0].key.mods;
    e_14.mouse = (mouseclick)local_860[0]._0_8_;
    e_13.key.mods = local_860[0].key.mods;
    e_13.mouse = (mouseclick)local_860[0]._0_8_;
    e_12.key.mods = local_860[0].key.mods;
    e_12.mouse = (mouseclick)local_860[0]._0_8_;
    e_11.key.mods = local_860[0].key.mods;
    e_11.mouse = (mouseclick)local_860[0]._0_8_;
    e_10.key.mods = local_860[0].key.mods;
    e_10.mouse = (mouseclick)local_860[0]._0_8_;
    e_09.key.mods = local_860[0].key.mods;
    e_09.mouse = (mouseclick)local_860[0]._0_8_;
    e_08.key.mods = local_860[0].key.mods;
    e_08.mouse = (mouseclick)local_860[0]._0_8_;
    e_07.key.mods = local_860[0].key.mods;
    e_07.mouse = (mouseclick)local_860[0]._0_8_;
    e_06.key.mods = local_860[0].key.mods;
    e_06.mouse = (mouseclick)local_860[0]._0_8_;
    e_05.key.mods = local_860[0].key.mods;
    e_05.mouse = (mouseclick)local_860[0]._0_8_;
    e_04.key.mods = local_860[0].key.mods;
    e_04.mouse = (mouseclick)local_860[0]._0_8_;
    e_03.key.mods = local_860[0].key.mods;
    e_03.mouse = (mouseclick)local_860[0]._0_8_;
    e_02.key.mods = local_860[0].key.mods;
    e_02.mouse = (mouseclick)local_860[0]._0_8_;
    e_01.key.mods = local_860[0].key.mods;
    e_01.mouse = (mouseclick)local_860[0]._0_8_;
    e_00.key.mods = local_860[0].key.mods;
    e_00.mouse = (mouseclick)local_860[0]._0_8_;
    e.key.mods = local_860[0].key.mods;
    e.mouse = (mouseclick)local_860[0]._0_8_;
    if ((char)local_8c8 != '\0') {
      if ((short)local_894 != 0) {
        uVar25 = local_894 & 0xffff;
        uVar26 = 0;
        do {
          wVar14 = path_g[uVar26].x;
          wVar19 = path_g[uVar26].y;
          _Var9 = panel_contains(wVar19,wVar14);
          if (_Var9) {
            move_cursor_relative(wVar19,wVar14);
            Term_addch(local_8b0[uVar26],local_8a8[uVar26]);
          }
          uVar26 = uVar26 + 1;
        } while (uVar25 != uVar26);
      }
      Term_fresh();
    }
    pmVar16 = (monster *)0x0;
    e._9_3_ = 0;
    _Var9 = event_is_mouse_m(e,'\x02','\x01');
    uVar25 = SUB84(local_860[0].mouse,4);
    if ((_Var9) || (e_00._9_3_ = 0, _Var9 = event_is_mouse(e_00,'\x03'), _Var9)) {
      pcVar6 = cave;
      wVar14 = (int)((uVar25 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) /
               (int)(uint)tile_height + Term->offset_y;
      x = (int)((uVar25 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
          Term->offset_x;
      local_908 = wVar14;
      if ((char)local_8dc == '\0') {
LAB_00208b2d:
        target_set_location(local_908,x);
      }
      else {
        lVar15 = (loc)loc(x,wVar14);
        pmVar16 = square_monster(pcVar6,lVar15);
        _Var9 = target_able(pmVar16);
        if (!_Var9) {
          bell();
          pcVar6 = cave;
          lVar15 = (loc)loc(x,wVar14);
          _Var9 = square_in_bounds(pcVar6,lVar15);
          uVar26 = local_8f8;
          uVar21 = local_8d8;
          if (!_Var9) {
            x = (player->grid).x;
            local_908 = (player->grid).y;
          }
          goto LAB_00208c2b;
        }
LAB_00208b1d:
        target_set_monster(pmVar16);
      }
LAB_00208bf1:
      uVar26 = CONCAT71((int7)((ulong)pmVar16 >> 8),1);
      uVar21 = local_8d8;
    }
    else {
      e_01._9_3_ = 0;
      _Var9 = event_is_mouse_m(e_01,'\x02','\x04');
      if (_Var9) {
        wVar14 = (int)((uVar25 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) /
                 (int)(uint)tile_height + Term->offset_y;
        pmVar16 = (monster *)(ulong)(uint)wVar14;
        x = (int)((uVar25 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
            Term->offset_x;
        cmdq_push(CMD_PATHFIND);
        cmd = (monster *)cmdq_peek();
        local_908 = wVar14;
        lVar15 = (loc)loc(x,wVar14);
LAB_00208be2:
        cmd_set_arg_point((command_conflict *)cmd,"point",lVar15);
        goto LAB_00208bf1;
      }
      e_02._9_3_ = 0;
      _Var9 = event_is_mouse(e_02,'\x02');
      x = local_904;
      if (_Var9) {
        uVar26 = 1;
        uVar21 = local_8d8;
        if ((((local_900 & 1U) != 0 && (char)local_8dc == '\0') &&
            (local_908 ==
             (int)((uVar25 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height
             + Term->offset_y)) &&
           (local_904 ==
            (int)((uVar25 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
            Term->offset_x)) {
          target_set_location(local_908,local_904);
          uVar21 = local_8d8;
        }
      }
      else {
        e_03._9_3_ = 0;
        _Var9 = event_is_mouse(e_03,'\x01');
        uVar26 = local_8f8;
        x = local_904;
        if (_Var9) {
          uVar24 = uVar25 >> 8 & 0xff;
          wVar19 = (int)(uVar24 - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
                   Term->offset_y;
          uVar25 = uVar25 & 0xff;
          wVar14 = (int)(uVar25 - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
                   Term->offset_x;
          if (uVar24 < 2) {
            wVar19 = wVar19 + L'\xffffffff';
          }
          else if ((int)uVar24 < Term->hgt + -2) {
            if (col_map[Term->sidebar_mode] < (int)uVar25) {
              wVar14 = wVar14 + (uint)(Term->wid + -2 <= (int)uVar25);
            }
            else {
              wVar14 = wVar14 + L'\xffffffff';
            }
          }
          else {
            wVar19 = wVar19 + L'\x01';
          }
          x = cave->width + L'\xffffffff';
          if (wVar14 < cave->width) {
            x = wVar14;
          }
          if (x < L'\x01') {
            x = L'\0';
          }
          local_908 = cave->height + L'\xffffffff';
          if (wVar19 < cave->height) {
            local_908 = wVar19;
          }
          if (local_908 < L'\x01') {
            local_908 = L'\0';
          }
          adjust_panel_help(local_908,x,(_Bool)((byte)local_8d8 & 1),player,local_900,&targets,
                            &show_interesting,&target_index);
          uVar21 = local_8d8;
        }
        else {
          e_04._9_3_ = 0;
          _Var9 = event_is_key(e_04,0xe000);
          if ((_Var9) || (e_05._9_3_ = 0, _Var9 = event_is_key(e_05,0x71), _Var9))
          goto LAB_00208bf1;
          e_06._9_3_ = 0;
          _Var9 = event_is_key(e_06,0x20);
          if ((_Var9) ||
             ((e_07._9_3_ = 0, _Var9 = event_is_key(e_07,0x2a), _Var9 ||
              (e_08._9_3_ = 0, _Var9 = event_is_key(e_08,0x2b), _Var9)))) {
            uVar26 = local_8f8;
            uVar21 = local_8d8;
            if ((char)local_8dc != '\0') {
              wVar19 = target_index + L'\x01';
              target_index = wVar19;
              wVar14 = point_set_size((point_set_conflict *)targets);
              uVar26 = local_8f8;
              uVar21 = local_8d8;
              if (wVar19 == wVar14) {
                target_index = L'\0';
              }
            }
          }
          else {
            e_09._9_3_ = 0;
            _Var9 = event_is_key(e_09,0x2d);
            uVar26 = local_8f8;
            if (_Var9) {
              uVar21 = local_8d8;
              if (((char)local_8dc != '\0') &&
                 (bVar27 = target_index == L'\0', target_index = target_index + L'\xffffffff',
                 bVar27)) {
                iVar13 = point_set_size((point_set_conflict *)targets);
                target_index = iVar13 + L'\xffffffff';
                uVar21 = local_8d8;
              }
            }
            else {
              e_10._9_3_ = 0;
              _Var9 = event_is_key(e_10,0x70);
              if (_Var9) {
                x = (player->grid).x;
                local_908 = (player->grid).y;
                show_interesting = false;
                verify_panel();
                handle_stuff(player);
                uVar26 = local_8f8;
                uVar21 = local_8d8;
              }
              else {
                e_11._9_3_ = 0;
                _Var9 = event_is_key(e_11,0x6f);
                if (_Var9) {
                  show_interesting = false;
                  uVar26 = local_8f8;
                  uVar21 = local_8d8;
                }
                else {
                  e_12._9_3_ = 0;
                  _Var9 = event_is_key(e_12,0x6d);
                  uVar26 = local_8f8;
                  if (_Var9) {
                    uVar21 = local_8d8;
                    if (((char)local_8dc == '\0') &&
                       (iVar13 = point_set_size((point_set_conflict *)targets), uVar21 = local_8d8,
                       0 < iVar13)) {
                      show_interesting = true;
                      target_index = L'\0';
                      iVar13 = point_set_size((point_set_conflict *)targets);
                      uVar21 = local_8d8;
                      if (0 < iVar13) {
                        wVar14 = L'ϧ';
                        lVar20 = 0;
                        do {
                          lVar18 = loc(x,local_908);
                          wVar19 = distance(lVar18,(loc_conflict)targets->pts[lVar20]);
                          if (wVar19 < wVar14) {
                            target_index = (wchar_t)lVar20;
                            wVar14 = wVar19;
                          }
                          lVar20 = lVar20 + 1;
                          iVar13 = point_set_size((point_set_conflict *)targets);
                          uVar26 = local_8f8;
                          uVar21 = local_8d8;
                        } while (lVar20 < iVar13);
                      }
                    }
                  }
                  else {
                    e_13._9_3_ = 0;
                    _Var9 = event_is_key(e_13,0x74);
                    if ((((_Var9) || (e_14._9_3_ = 0, _Var9 = event_is_key(e_14,0x35), _Var9)) ||
                        (e_15._9_3_ = 0, _Var9 = event_is_key(e_15,0x30), _Var9)) ||
                       (e_16._9_3_ = 0, _Var9 = event_is_key(e_16,0x2e), _Var9)) {
                      pcVar6 = cave;
                      if ((char)local_8dc == '\0') goto LAB_00208b2d;
                      lVar15 = (loc)loc(x,local_908);
                      pmVar16 = square_monster(pcVar6,lVar15);
                      _Var9 = target_able(pmVar16);
                      if (_Var9) goto LAB_00208b1d;
                      bell();
                      uVar26 = local_8f8;
                      uVar21 = local_8d8;
                    }
                    else {
                      e_17._9_3_ = 0;
                      _Var9 = event_is_key(e_17,0x67);
                      if (_Var9) {
                        cmdq_push(CMD_PATHFIND);
                        pmVar16 = (monster *)cmdq_peek();
                        lVar15 = (loc)loc(x,local_908);
                        cmd = pmVar16;
                        goto LAB_00208be2;
                      }
                      e_18._9_3_ = 0;
                      _Var9 = event_is_key(e_18,local_89c);
                      pcVar6 = cave;
                      if (_Var9) {
                        uVar26 = local_8f8;
                        x = local_904;
                        uVar21 = local_8d8;
                        if ((local_900 & 1U) != 0) goto LAB_00208c2b;
                        lVar15 = (loc)loc(local_904,local_908);
                        poVar17 = square_object(pcVar6,lVar15);
                        bVar27 = poVar17 != (object *)0x0;
                        if (poVar17 == (object *)0x0) {
LAB_00209119:
                          uVar26 = local_8f8;
                          x = local_904;
                          uVar21 = local_8d8;
                          if (!bVar27) goto LAB_00208c2b;
                        }
                        else {
                          poVar5 = player->upkeep->object;
                          if (poVar5 != poVar17) {
                            do {
                              poVar17 = poVar17->next;
                              bVar27 = poVar17 != (object *)0x0;
                              if (poVar5 == poVar17) break;
                            } while (poVar17 != (object *)0x0);
                            goto LAB_00209119;
                          }
                        }
                        textui_cmd_ignore_menu(player->upkeep->object);
                        handle_stuff(player);
                        point_set_dispose((point_set_conflict *)targets);
                        targets = target_get_monsters(local_900,(monster_predicate)0x0,true);
                        uVar26 = local_8f8;
                        x = local_904;
                        uVar21 = local_8d8;
                        goto LAB_00208c2b;
                      }
                      e_19._9_3_ = 0;
                      _Var9 = event_is_key(e_19,0x3e);
                      ppVar23 = player;
                      if (_Var9) {
                        lVar18 = loc(local_904,local_908);
                        pred = square_isdownstairs;
LAB_002091de:
                        wVar14 = path_nearest_known(ppVar23,lVar18,pred,(loc_conflict *)&new_grid,
                                                    (int16_t **)0x0);
LAB_002091ee:
                        x = new_grid.x;
                        if (L'\0' < wVar14) {
                          local_908 = new_grid.y;
                          adjust_panel_help(new_grid.y,new_grid.x,(_Bool)((byte)local_8d8 & 1),
                                            player,local_900,&targets,&show_interesting,
                                            &target_index);
                          uVar26 = local_8f8;
                          uVar21 = local_8d8;
                          goto LAB_00208c2b;
                        }
                      }
                      else {
                        e_20._9_3_ = 0;
                        _Var9 = event_is_key(e_20,0x3c);
                        ppVar23 = player;
                        if (_Var9) {
                          lVar18 = loc(local_904,local_908);
                          pred = square_isupstairs;
                          goto LAB_002091de;
                        }
                        e_21._9_3_ = 0;
                        _Var9 = event_is_key(e_21,0x78);
                        ppVar23 = player;
                        if (_Var9) {
                          lVar18 = loc(local_904,local_908);
                          wVar14 = path_nearest_unknown
                                             (ppVar23,lVar18,(loc_conflict *)&new_grid,
                                              (int16_t **)0x0);
                          goto LAB_002091ee;
                        }
                        e_22._9_3_ = 0;
                        _Var9 = event_is_key(e_22,0x3f);
                        uVar7 = local_8d8;
                        if (_Var9) {
                          uVar21 = local_8d8 & 0xffffffff ^ 1;
                          puVar1 = &player->upkeep->redraw;
                          *puVar1 = *puVar1 | 0x5bfff;
                          Term_clear();
                          handle_stuff(player);
                          uVar26 = local_8f8;
                          x = local_904;
                          if ((uVar7 & 1) != 0) {
                            prt("Press \'?\' for help.",local_8bc,L'\0');
                            uVar26 = local_8f8;
                            x = local_904;
                          }
                          goto LAB_00208c2b;
                        }
                        ch._9_3_ = 0;
                        wVar14 = target_dir_allow(ch,false);
                        if (wVar14 != L'\0') {
                          if ((char)local_8dc == '\0') {
                            ch_00._9_3_ = 0;
                            _Var9 = is_running_keymap(ch_00);
                            iVar13 = (uint)_Var9 + (uint)_Var9 * 8 + 1;
                            wVar19 = ddx[wVar14] * iVar13 + local_904;
                            wVar14 = ddy[wVar14] * iVar13 + local_908;
                            x = cave->width + L'\xfffffffe';
                            if (wVar19 < x) {
                              x = wVar19;
                            }
                            if (x < L'\x02') {
                              x = L'\x01';
                            }
                            local_908 = cave->height + L'\xfffffffe';
                            if (wVar14 < local_908) {
                              local_908 = wVar14;
                            }
                            if (local_908 < L'\x02') {
                              local_908 = L'\x01';
                            }
                            adjust_panel_help(local_908,x,(_Bool)((byte)local_8d8 & 1),player,
                                              local_900,&targets,(_Bool *)0x0,(int *)0x0);
                            uVar26 = local_8f8;
                            uVar21 = local_8d8;
                          }
                          else {
                            wVar19 = targets->pts[target_index].x;
                            wVar4 = targets->pts[target_index].y;
                            sVar2 = ddy[wVar14];
                            sVar3 = ddx[wVar14];
                            uVar12 = target_pick(wVar4,wVar19,(int)sVar2,(int)sVar3,targets);
                            if ((short)uVar12 < 0) {
                              local_8c8 = CONCAT44(local_8c8._4_4_,Term->offset_x);
                              local_8b8 = (object *)CONCAT44(local_8b8._4_4_,Term->offset_y);
                              _Var9 = change_panel(wVar14);
                              if (_Var9) {
                                point_set_dispose((point_set_conflict *)targets);
                                targets = target_get_monsters(local_900,(monster_predicate)0x0,true)
                                ;
                                uVar12 = target_pick(wVar4,wVar19,(int)sVar2,(int)sVar3,targets);
                                if ((short)uVar12 < 0) {
                                  _Var9 = modify_panel((term_conflict *)Term,(wchar_t)local_8b8,
                                                       (wchar_t)local_8c8);
                                  if (_Var9) {
                                    point_set_dispose((point_set_conflict *)targets);
                                    targets = target_get_monsters(local_900,(monster_predicate)0x0,
                                                                  true);
                                  }
                                }
                                handle_stuff(player);
                              }
                            }
                            uVar26 = local_8f8;
                            x = local_904;
                            uVar21 = local_8d8;
                            if (-1 < (short)uVar12) {
                              target_index = (wchar_t)uVar12;
                            }
                          }
                          goto LAB_00208c2b;
                        }
                      }
                      bell();
                      uVar26 = local_8f8;
                      x = local_904;
                      uVar21 = local_8d8;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00208c2b:
    local_8d8 = uVar21;
    if ((uVar26 & 1) != 0) {
      point_set_dispose((point_set_conflict *)targets);
      if ((local_8d8 & 1) == 0) {
        prt("",L'\0',L'\0');
        prt("",local_8bc,L'\0');
        puVar1 = &player->upkeep->redraw;
        *puVar1 = *puVar1 | 0x3000;
      }
      else {
        puVar1 = &player->upkeep->redraw;
        *puVar1 = *puVar1 | 0x5bfff;
        Term_clear();
      }
      verify_panel();
      handle_stuff(player);
      mem_free(local_8b0);
      mem_free(local_8a8);
      allow_animations();
      _Var9 = target_is_set();
      return _Var9;
    }
  } while( true );
}

Assistant:

bool target_set_interactive(int mode, int x, int y)
{
	int path_n;
	struct loc path_g[256];

	int wid, hgt, help_prompt_loc;

	bool done = false;
	bool show_interesting = true;
	bool help = false;
	keycode_t ignore_key = cmd_lookup_key(CMD_IGNORE,
		(OPT(player, rogue_like_commands)) ?
		KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG);

	/* These are used for displaying the path to the target */
	wchar_t *path_char = mem_zalloc(z_info->max_range * sizeof(wchar_t));
	int *path_attr = mem_zalloc(z_info->max_range * sizeof(int));

	/* If we haven't been given an initial location, start on the
	   player, otherwise  honour it by going into "free targetting" mode. */
	if (x == -1 || y == -1 || !square_in_bounds_fully(cave, loc(x, y))) {
		x = player->grid.x;
		y = player->grid.y;
	} else {
		show_interesting = false;
	}

	/* Cancel target */
	target_set_monster(0);

	/* Prevent animations */
	disallow_animations();

	/* Calculate the window location for the help prompt */
	Term_get_size(&wid, &hgt);
	help_prompt_loc = hgt - 1;
	
	/* Display the help prompt */
	prt("Press '?' for help.", help_prompt_loc, 0);

	/* Prepare the target set */
	struct point_set *targets = target_get_monsters(mode, NULL, true);
	int target_index = 0;

	/* Interact */
	while (!done) {
		bool path_drawn = false;
		bool use_interesting_mode = show_interesting && point_set_size(targets);
		bool use_free_mode = !use_interesting_mode;

		/* Use an interesting grid if requested and there are any */
		if (use_interesting_mode) {
			y = targets->pts[target_index].y;
			x = targets->pts[target_index].x;

			/* Adjust panel if needed */
			adjust_panel_help(y, x, help, player, mode, NULL,
				NULL, NULL);
		}

		/* Update help */
		if (help) {
			bool has_target = target_able(square_monster(cave, loc(x, y)));
			bool has_object = !(mode & TARGET_KILL)
					&& pile_has_known(square_object(cave, loc(x, y)));
			target_display_help(has_target, has_object, use_free_mode);
		}

		/* Find the path. */
		path_n = project_path(cave, path_g, z_info->max_range,
							  loc(player->grid.x, player->grid.y), loc(x, y),
							  PROJECT_THRU | PROJECT_INFO);

		/* Draw the path in "target" mode. If there is one */
		if (mode & (TARGET_KILL))
			path_drawn = draw_path(path_n, path_g, path_char, path_attr,
					player->grid.y, player->grid.x);

		/* Describe and Prompt */
		ui_event press = target_set_interactive_aux(y, x,
				mode | (use_free_mode ? TARGET_LOOK : 0));

		/* Remove the path */
		if (path_drawn) load_path(path_n, path_g, path_char, path_attr);

		/* Handle an input event */
		if (event_is_mouse_m(press, 2, KC_MOD_CONTROL) || event_is_mouse(press, 3)) {
			/* Set a target and done */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);
			if (use_free_mode) {
				/* Free mode: Target a location */
				target_set_location(y, x);
				done = true;
			} else {
				/* Interesting mode: Try to target a monster and done, or bell */
				struct monster *m_local = square_monster(cave, loc(x, y));

				if (target_able(m_local)) {
					/* Monster race and health tracked by target_set_interactive_aux() */
					target_set_monster(m_local);
					done = true;
				} else {
					bell();
					if (!square_in_bounds(cave, loc(x, y))) {
						x = player->grid.x;
						y = player->grid.y;
					}
				}
			}

		} else if (event_is_mouse_m(press, 2, KC_MOD_ALT)) {
			/* Navigate to location and done */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);
			cmdq_push(CMD_PATHFIND);
			cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
			done = true;

		} else if (event_is_mouse(press, 2)) {
			/* Cancel and done */
			if (use_free_mode && (mode & TARGET_KILL)
					&& y == KEY_GRID_Y(press) && x == KEY_GRID_X(press)) {
				/* Free/kill mode: Clicked current location, set target */
				target_set_location(y, x);
			}
			done = true;

		} else if (event_is_mouse(press, 1)) {
			/* Relocate cursor */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);

			/* If they clicked on an edge of the map, drag the cursor further
			   to trigger a panel scroll */
			if (press.mouse.y <= 1) {
				y--;
			} else if (press.mouse.y >= Term->hgt - 2) {
				y++;
			} else if (press.mouse.x <= COL_MAP) {
				x--;
			} else if (press.mouse.x >= Term->wid - 2) {
				x++;
			}

			/* Restrict cursor to inbounds */
			x = MAX(0, MIN(x, cave->width - 1));
			y = MAX(0, MIN(y, cave->height - 1));

			/*
			 * Adjust panel and target list if needed; also
			 * adjust interesting mode
			 */
			adjust_panel_help(y, x, help, player, mode, &targets,
				&show_interesting, &target_index);

		} else if (event_is_key(press, ESCAPE) || event_is_key(press, 'q')) {
			/* Cancel */
			done = true;

		} else if (event_is_key(press, ' ') || event_is_key(press, '*')
				|| event_is_key(press, '+')) {
			/* Cycle interesting target forward */
			if (use_interesting_mode && ++target_index == point_set_size(targets)) {
				target_index = 0;
			}

		} else if (event_is_key(press, '-')) {
			/* Cycle interesting target backwards */
			if (use_interesting_mode && target_index-- == 0) {
				target_index = point_set_size(targets) - 1;
			}

		} else if (event_is_key(press, 'p')) {
			/* Focus the player and switch to free mode */
			y = player->grid.y;
			x = player->grid.x;
			show_interesting = false;

			/* Recenter around player */
			verify_panel();
			handle_stuff(player);

		} else if (event_is_key(press, 'o')) {
			/* Switch to free mode */
			show_interesting = false;

		} else if (event_is_key(press, 'm')) {
			/* Switch to interesting mode */
			if (use_free_mode && point_set_size(targets) > 0) {
				show_interesting = true;
				target_index = 0;
				int min_dist = 999;

				/* Pick the nearest interesting target */
				for (int i = 0; i < point_set_size(targets); i++) {
					int dist = distance(loc(x, y), targets->pts[i]);
					if (dist < min_dist) {
						target_index = i;
						min_dist = dist;
					}
				}
			}

		} else if (event_is_key(press, 't') || event_is_key(press, '5')
				|| event_is_key(press, '0') || event_is_key(press, '.')) {
			/* Set a target and done */
			if (use_interesting_mode) {
				struct monster *m_local = square_monster(cave, loc(x, y));

				if (target_able(m_local)) {
					/* Monster race and health tracked by target_set_interactive_aux() */
					target_set_monster(m_local);
					done = true;
				} else {
					bell();
				}
			} else {
				target_set_location(y, x);
				done = true;
			}

		} else if (event_is_key(press, 'g')) {
			/* Navigate to a location and done */
			cmdq_push(CMD_PATHFIND);
			cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
			done = true;

		} else if (event_is_key(press, ignore_key)) {
			/* Ignore the tracked object, set by target_set_interactive_aux() */
			if (!(mode & TARGET_KILL)
					&& pile_is_tracked(square_object(cave, loc(x, y)))) {
				textui_cmd_ignore_menu(player->upkeep->object);
				handle_stuff(player);

				/* Recalculate interesting grids */
				point_set_dispose(targets);
				targets = target_get_monsters(mode, NULL, true);
			}

		} else if (event_is_key(press, '>')) {
			struct loc new_grid;

			if (path_nearest_known(player, loc(x, y),
					square_isdownstairs, &new_grid, NULL)
					> 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, '<')) {
			struct loc new_grid;

			if (path_nearest_known(player, loc(x, y),
					square_isupstairs, &new_grid, NULL)
					> 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, 'x')) {
			struct loc new_grid;

			if (path_nearest_unknown(player, loc(x, y), &new_grid,
					NULL) > 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, '?')) {
			/* Toggle help text */
			help = !help;

			/* Redraw main window */
			player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP);
			Term_clear();
			handle_stuff(player);
			if (!help)
				prt("Press '?' for help.", help_prompt_loc, 0);

		} else {
			/* Try to extract a direction from the key press */
			int dir = target_dir(press.key);

			if (!dir) {
				bell();
			} else if (use_interesting_mode) {
				/* Interesting mode direction: Pick new interesting grid */
				int old_y = targets->pts[target_index].y;
				int old_x = targets->pts[target_index].x;
				int new_index;

				/* Look for a new interesting grid */
				new_index = target_pick(old_y, old_x, ddy[dir], ddx[dir], targets);

				/* If none found, try in the next panel */
				if (new_index < 0) {
					int old_wy = Term->offset_y;
					int old_wx = Term->offset_x;

					if (change_panel(dir)) {
						/* Recalculate interesting grids */
						point_set_dispose(targets);
						targets = target_get_monsters(mode, NULL, true);

						/* Look for a new interesting grid again */
						new_index = target_pick(old_y, old_x, ddy[dir], ddx[dir], targets);

						/* If none found again, reset the panel and do nothing */
						if (new_index < 0 && modify_panel(Term, old_wy, old_wx)) {
							/* Recalculate interesting grids */
							point_set_dispose(targets);
							targets = target_get_monsters(mode, NULL, true);
						}

						handle_stuff(player);
					}
				}

				/* Use interesting grid if found */
				if (new_index >= 0) target_index = new_index;
			} else {
				int step = (is_running_keymap(press.key)) ?
					10 : 1;

				/* Free mode direction: Move cursor */
				x += step * ddx[dir];
				y += step * ddy[dir];

				/* Keep 1 away from the edge */
				x = MAX(1, MIN(x, cave->width - 2));
				y = MAX(1, MIN(y, cave->height - 2));

				/* Adjust panel and target list if needed */
				adjust_panel_help(y, x, help, player, mode,
					&targets, NULL, NULL);
			}
		}
		/* End of while finally */
	}

	/* Forget */
	point_set_dispose(targets);

	/* Redraw as necessary */
	if (help) {
		player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP);
		Term_clear();
	} else {
		prt("", 0, 0);
		prt("", help_prompt_loc, 0);
		player->upkeep->redraw |= (PR_DEPTH | PR_STATUS);
	}

	/* Recenter around player */
	verify_panel();

	handle_stuff(player);

	mem_free(path_attr);
	mem_free(path_char);

	/* Allow animations again */
	allow_animations();

	return target_is_set();
}